

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O3

void pre_process_context(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                        JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr
                        ,JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  uint uVar2;
  jpeg_c_prep_controller *pjVar3;
  JSAMPARRAY input_array;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  JDIMENSION JVar9;
  int row;
  int iVar10;
  
  if (*out_row_group_ctr < out_row_groups_avail) {
    pjVar3 = cinfo->prep;
    iVar4 = cinfo->max_v_samp_factor * 3;
    pjVar1 = pjVar3 + 1;
    do {
      uVar2 = *in_row_ctr;
      if (uVar2 < in_rows_avail) {
        JVar9 = *(JDIMENSION *)((long)&pjVar3[6].start_pass + 4);
        uVar8 = *(int *)((long)&pjVar3[6].pre_process_data + 4) - JVar9;
        if (in_rows_avail - uVar2 <= uVar8) {
          uVar8 = in_rows_avail - uVar2;
        }
        (*cinfo->cconvert->color_convert)(cinfo,input_buf + uVar2,(JSAMPIMAGE)pjVar1,JVar9,uVar8);
        if ((*(JDIMENSION *)&pjVar3[6].start_pass == cinfo->image_height) &&
           (iVar7 = cinfo->num_components, 0 < iVar7)) {
          iVar5 = cinfo->max_v_samp_factor;
          lVar6 = 0;
          do {
            if (0 < iVar5) {
              iVar10 = 0;
              iVar7 = -1;
              do {
                jcopy_sample_rows((JSAMPARRAY)(&pjVar1->start_pass)[lVar6],0,
                                  (JSAMPARRAY)(&pjVar1->start_pass)[lVar6],iVar7,1,
                                  cinfo->image_width);
                iVar5 = cinfo->max_v_samp_factor;
                iVar10 = iVar10 + 1;
                iVar7 = iVar7 + -1;
              } while (iVar10 < iVar5);
              iVar7 = cinfo->num_components;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < iVar7);
        }
        *in_row_ctr = *in_row_ctr + uVar8;
        iVar5 = *(int *)((long)&pjVar3[6].start_pass + 4) + uVar8;
        *(int *)((long)&pjVar3[6].start_pass + 4) = iVar5;
        *(uint *)&pjVar3[6].start_pass = *(int *)&pjVar3[6].start_pass - uVar8;
        iVar7 = *(int *)((long)&pjVar3[6].pre_process_data + 4);
LAB_00111047:
        JVar9 = *out_row_group_ctr;
        if (iVar5 == iVar7) goto LAB_0011104f;
      }
      else {
        if (*(int *)&pjVar3[6].start_pass != 0) {
          return;
        }
        iVar5 = *(int *)((long)&pjVar3[6].start_pass + 4);
        iVar7 = *(int *)((long)&pjVar3[6].pre_process_data + 4);
        if (iVar7 <= iVar5) goto LAB_00111047;
        iVar5 = cinfo->num_components;
        if (0 < iVar5) {
          lVar6 = 0;
          do {
            iVar7 = *(int *)((long)&pjVar3[6].start_pass + 4);
            iVar10 = *(int *)((long)&pjVar3[6].pre_process_data + 4);
            if (iVar7 < iVar10) {
              input_array = (JSAMPARRAY)(&pjVar3[1].start_pass)[lVar6];
              JVar9 = cinfo->image_width;
              iVar5 = iVar7 + -1;
              do {
                jcopy_sample_rows(input_array,iVar5,input_array,iVar7,1,JVar9);
                iVar7 = iVar7 + 1;
              } while (iVar10 != iVar7);
              iVar5 = cinfo->num_components;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < iVar5);
          iVar7 = *(int *)((long)&pjVar3[6].pre_process_data + 4);
        }
        *(int *)((long)&pjVar3[6].start_pass + 4) = iVar7;
        JVar9 = *out_row_group_ctr;
LAB_0011104f:
        (*cinfo->downsample->downsample)
                  (cinfo,(JSAMPIMAGE)pjVar1,*(JDIMENSION *)&pjVar3[6].pre_process_data,output_buf,
                   JVar9);
        *out_row_group_ctr = *out_row_group_ctr + 1;
        iVar7 = cinfo->max_v_samp_factor;
        iVar5 = *(int *)&pjVar3[6].pre_process_data + iVar7;
        if (iVar4 <= iVar5) {
          iVar5 = 0;
        }
        *(int *)&pjVar3[6].pre_process_data = iVar5;
        iVar5 = *(int *)((long)&pjVar3[6].start_pass + 4);
        if (iVar4 <= iVar5) {
          *(undefined4 *)((long)&pjVar3[6].start_pass + 4) = 0;
          iVar5 = 0;
        }
        *(int *)((long)&pjVar3[6].pre_process_data + 4) = iVar5 + iVar7;
        JVar9 = *out_row_group_ctr;
      }
    } while (JVar9 < out_row_groups_avail);
  }
  return;
}

Assistant:

METHODDEF(void)
pre_process_context (j_compress_ptr cinfo,
		     JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		     JDIMENSION in_rows_avail,
		     JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		     JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  int buf_height = cinfo->max_v_samp_factor * 3;
  JDIMENSION inrows;

  while (*out_row_group_ctr < out_row_groups_avail) {
    if (*in_row_ctr < in_rows_avail) {
      /* Do color conversion to fill the conversion buffer. */
      inrows = in_rows_avail - *in_row_ctr;
      numrows = prep->next_buf_stop - prep->next_buf_row;
      numrows = (int) MIN((JDIMENSION) numrows, inrows);
      (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
					 prep->color_buf,
					 (JDIMENSION) prep->next_buf_row,
					 numrows);
      /* Pad at top of image, if first time through */
      if (prep->rows_to_go == cinfo->image_height) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  int row;
	  for (row = 1; row <= cinfo->max_v_samp_factor; row++) {
	    jcopy_sample_rows(prep->color_buf[ci], 0,
			      prep->color_buf[ci], -row,
			      1, cinfo->image_width);
	  }
	}
      }
      *in_row_ctr += numrows;
      prep->next_buf_row += numrows;
      prep->rows_to_go -= numrows;
    } else {
      /* Return for more data, unless we are at the bottom of the image. */
      if (prep->rows_to_go != 0)
	break;
      /* When at bottom of image, pad to fill the conversion buffer. */
      if (prep->next_buf_row < prep->next_buf_stop) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			     prep->next_buf_row, prep->next_buf_stop);
	}
	prep->next_buf_row = prep->next_buf_stop;
      }
    }
    /* If we've gotten enough data, downsample a row group. */
    if (prep->next_buf_row == prep->next_buf_stop) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf,
					(JDIMENSION) prep->this_row_group,
					output_buf, *out_row_group_ctr);
      (*out_row_group_ctr)++;
      /* Advance pointers with wraparound as necessary. */
      prep->this_row_group += cinfo->max_v_samp_factor;
      if (prep->this_row_group >= buf_height)
	prep->this_row_group = 0;
      if (prep->next_buf_row >= buf_height)
	prep->next_buf_row = 0;
      prep->next_buf_stop = prep->next_buf_row + cinfo->max_v_samp_factor;
    }
  }
}